

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

int diwcmp(void *a,void *b)

{
  GLWall *pGVar1;
  GLWall *pGVar2;
  GLWall *w2;
  GLDrawItem *di2;
  GLWall *w1;
  GLDrawItem *di1;
  void *b_local;
  void *a_local;
  
  pGVar1 = TArray<GLWall,_GLWall>::operator[](&sortinfo->walls,(long)*(int *)((long)a + 4));
  pGVar2 = TArray<GLWall,_GLWall>::operator[](&sortinfo->walls,(long)*(int *)((long)b + 4));
  if (pGVar1->gltexture == pGVar2->gltexture) {
    a_local._4_4_ = (pGVar1->flags & 3) - (pGVar2->flags & 3);
  }
  else {
    a_local._4_4_ = (int)(((long)pGVar1->gltexture - (long)pGVar2->gltexture) / 0x58);
  }
  return a_local._4_4_;
}

Assistant:

static int diwcmp (const void *a, const void *b)
{
	const GLDrawItem * di1 = (const GLDrawItem *)a;
	GLWall * w1=&sortinfo->walls[di1->index];

	const GLDrawItem * di2 = (const GLDrawItem *)b;
	GLWall * w2=&sortinfo->walls[di2->index];

	if (w1->gltexture != w2->gltexture) return w1->gltexture - w2->gltexture;
	return ((w1->flags & 3) - (w2->flags & 3));
}